

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<unsigned_int>::Clear
          (RepeatedFieldWrapper<unsigned_int> *this,Field *data)

{
  ulong uVar1;
  int iVar2;
  LongSooRep *this_00;
  bool is_soo;
  
  this_00 = (LongSooRep *)(**(code **)(*(long *)this + 0x88))();
  uVar1 = this_00->elements_int;
  if ((uVar1 & 4) != 0) {
    LongSooRep::elements(this_00);
  }
  is_soo = (uVar1 & 4) == 0;
  SooRep::size((SooRep *)this_00,is_soo);
  iVar2 = SooRep::size((SooRep *)this_00,is_soo);
  if ((iVar2 != 0) && ((this_00->elements_int & 4) != 0)) {
    LongSooRep::elements(this_00);
  }
  RepeatedField<unsigned_int>::set_size((RepeatedField<unsigned_int> *)this_00,(uVar1 & 4) == 0,0);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }